

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

Color * __thiscall
Scene::shade(Color *__return_storage_ptr__,Scene *this,Medium *curMed,double weight,Vector *p,
            Vector *view,GeometricObject *obj)

{
  pointer psVar1;
  long *plVar2;
  long lVar3;
  undefined1 auVar4 [16];
  Medium *pMVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  Color *color;
  Vector l;
  undefined1 local_178 [16];
  double local_168;
  Medium *local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  ulong uStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  undefined8 uStack_110;
  undefined1 local_100 [96];
  double dStack_a0;
  double local_98;
  Ray local_78;
  Color local_48;
  
  local_158 = curMed;
  GeometricObject::find_texture(obj,p,(SurfaceData *)local_100);
  uStack_130 = 0;
  local_118 = view->z * local_98 + view->x * (double)local_100._88_8_ + dStack_a0 * view->y;
  uStack_110 = 0;
  local_138 = local_118;
  if (0.0 < local_118) {
    auVar4._8_4_ = local_100._96_4_;
    auVar4._0_8_ = -(double)local_100._88_8_;
    auVar4._12_4_ = local_100._100_4_ ^ 0x80000000;
    stack0xffffffffffffff58 = auVar4;
    local_98 = -local_98;
    local_138 = -local_118;
    uStack_130 = 0x8000000000000000;
  }
  local_78.org.x = p->x;
  local_78.org.y = p->y;
  local_78.org.z = p->z;
  dVar8 = (this->ambient).z;
  dVar10 = (this->ambient).y;
  __return_storage_ptr__->x = (double)local_100._0_8_ * (double)local_100._40_8_ * (this->ambient).x
  ;
  __return_storage_ptr__->y = (double)local_100._0_8_ * (double)local_100._48_8_ * dVar10;
  __return_storage_ptr__->z = dVar8 * (double)local_100._56_8_ * (double)local_100._0_8_;
  lVar6 = 0;
  uVar7 = 0;
  do {
    psVar1 = (this->light).
             super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->light).
                      super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar7) {
      dVar8 = weight * (double)local_100._32_8_;
      if ((threshold < (double)local_100._24_8_ * weight) && (level < maxLevel)) {
        dVar10 = local_138 + local_138;
        local_78.dir.z = view->z - local_98 * dVar10;
        local_78.dir.x = view->x - dVar10 * (double)local_100._88_8_;
        local_78.dir.y = view->y - dVar10 * dStack_a0;
        trace(&local_48,this,local_158,(double)local_100._24_8_ * weight,&local_78);
        local_168 = local_48.z * (double)local_100._24_8_;
        local_178._8_8_ = (double)local_100._24_8_ * local_48.y;
        local_178._0_8_ = (double)local_100._24_8_ * local_48.x;
        Vector::operator+=(__return_storage_ptr__,(Vector *)local_178);
      }
      if ((threshold < dVar8) && (level < maxLevel)) {
        if (local_118 <= 0.0) {
          pMVar5 = (Medium *)(local_100 + 0x40);
        }
        else {
          pMVar5 = &Grayzer::Medium::air;
        }
        dVar9 = local_158->ior / pMVar5->ior;
        dVar10 = (local_138 * local_138 + -1.0) * dVar9 * dVar9 + 1.0;
        if (threshold < dVar10) {
          dVar12 = view->z;
          dVar13 = dVar9 * view->x;
          dVar14 = dVar9 * view->y;
          if (dVar10 < 0.0) {
            local_138 = -local_138;
            uStack_130 = uStack_130 ^ 0x8000000000000000;
            local_128 = dVar13;
            dStack_120 = dVar14;
            dVar10 = sqrt(dVar10);
            dVar11 = local_138;
            dVar13 = local_128;
            dVar14 = dStack_120;
          }
          else {
            dVar10 = SQRT(dVar10);
            dVar11 = -local_138;
          }
          dVar10 = dVar9 * dVar11 - dVar10;
          local_78.dir.x = dVar13 + dVar10 * (double)local_100._88_8_;
          local_78.dir.y = dVar14 + dVar10 * dStack_a0;
          local_78.dir.z = dVar12 * dVar9 + dVar10 * local_98;
          if (0.0 < local_118) {
            pMVar5 = &Grayzer::Medium::air;
          }
          else {
            pMVar5 = (Medium *)(local_100 + 0x40);
          }
          trace(&local_48,this,pMVar5,dVar8,&local_78);
          local_168 = local_48.z * (double)local_100._32_8_;
          local_178._8_8_ = (double)local_100._32_8_ * local_48.y;
          local_178._0_8_ = (double)local_100._32_8_ * local_48.x;
          Vector::operator+=(__return_storage_ptr__,(Vector *)local_178);
        }
      }
      return __return_storage_ptr__;
    }
    plVar2 = *(long **)((long)&(psVar1->super___shared_ptr<LightSource,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr + lVar6);
    dVar8 = (double)(**(code **)(*plVar2 + 0x10))(plVar2,this,p,&local_150);
    if (threshold < dVar8) {
      dVar10 = local_140 * local_98 + local_150 * (double)local_100._88_8_ + local_148 * dStack_a0;
      if (dVar10 <= threshold) {
        if ((dVar10 < -threshold) && (threshold < (double)local_100._32_8_)) {
          dVar10 = dVar10 * -(double)local_100._8_8_ * (double)local_100._32_8_ * dVar8;
          if (threshold < dVar10) {
            lVar3 = *(long *)((long)&(((this->light).
                                       super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<LightSource,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr + lVar6);
            local_168 = *(double *)(lVar3 + 0x18) * (double)local_100._56_8_ * dVar10;
            dVar9 = dVar10 * (double)local_100._48_8_ * *(double *)(lVar3 + 0x10);
            local_178._8_4_ = SUB84(dVar9,0);
            local_178._0_8_ = dVar10 * (double)local_100._40_8_ * *(double *)(lVar3 + 8);
            local_178._12_4_ = (int)((ulong)dVar9 >> 0x20);
            Vector::operator+=(__return_storage_ptr__,(Vector *)local_178);
          }
          dVar8 = dVar8 * (double)local_100._32_8_ * (double)local_100._16_8_;
          if (threshold < dVar8) {
            if (threshold < view->x - local_150) {
              if (threshold < view->y - local_148) {
                if (threshold < view->z - local_140) {
                  pMVar5 = (Medium *)(local_100 + 0x40);
                  if (0.0 < local_118) {
                    pMVar5 = &Grayzer::Medium::air;
                  }
                  dVar10 = pMVar5->ior / local_158->ior;
                  dVar12 = -view->x - local_150 * dVar10;
                  dVar13 = -view->y - local_148 * dVar10;
                  dVar10 = -view->z - local_140 * dVar10;
                  dVar9 = SQRT(dVar10 * dVar10 + dVar12 * dVar12 + dVar13 * dVar13);
                  lVar3 = *(long *)((long)&(((this->light).
                                             super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super___shared_ptr<LightSource,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr + lVar6);
                  local_128 = *(double *)(lVar3 + 0x18) * dVar8;
                  dVar10 = (dVar10 / dVar9) * local_98 +
                           (dVar12 / dVar9) * (double)local_100._88_8_ +
                           (dVar13 / dVar9) * dStack_a0;
                  dVar9 = *(double *)(lVar3 + 8);
                  dVar12 = *(double *)(lVar3 + 0x10);
                  goto LAB_00104f50;
                }
              }
            }
          }
        }
      }
      else {
        if (threshold < (double)local_100._8_8_) {
          lVar3 = *(long *)((long)&(((this->light).
                                     super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<LightSource,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr + lVar6);
          dVar10 = dVar10 * (double)local_100._8_8_ * dVar8;
          local_168 = *(double *)(lVar3 + 0x18) * (double)local_100._56_8_ * dVar10;
          dVar9 = dVar10 * (double)local_100._48_8_ * *(double *)(lVar3 + 0x10);
          local_178._8_4_ = SUB84(dVar9,0);
          local_178._0_8_ = dVar10 * (double)local_100._40_8_ * *(double *)(lVar3 + 8);
          local_178._12_4_ = (int)((ulong)dVar9 >> 0x20);
          Vector::operator+=(__return_storage_ptr__,(Vector *)local_178);
        }
        if (threshold < (double)local_100._16_8_) {
          dVar9 = local_150 - view->x;
          dVar12 = local_148 - view->y;
          dVar10 = local_140 - view->z;
          dVar13 = SQRT(dVar10 * dVar10 + dVar9 * dVar9 + dVar12 * dVar12);
          lVar3 = *(long *)((long)&(((this->light).
                                     super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<LightSource,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr + lVar6);
          local_128 = *(double *)(lVar3 + 0x18) * (double)local_100._16_8_ * dVar8;
          dVar10 = (dVar10 / dVar13) * local_98 +
                   (dVar9 / dVar13) * (double)local_100._88_8_ + (dVar12 / dVar13) * dStack_a0;
          dVar9 = (double)local_100._16_8_ * *(double *)(lVar3 + 8);
          dVar12 = (double)local_100._16_8_ * *(double *)(lVar3 + 0x10);
LAB_00104f50:
          dVar10 = pow(dVar10,(double)(int)local_100._80_4_);
          local_168 = local_128 * dVar10;
          dVar12 = dVar10 * dVar8 * dVar12;
          local_178._8_4_ = SUB84(dVar12,0);
          local_178._0_8_ = dVar10 * dVar8 * dVar9;
          local_178._12_4_ = (int)((ulong)dVar12 >> 0x20);
          Vector::operator+=(__return_storage_ptr__,(Vector *)local_178);
        }
      }
    }
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x10;
  } while( true );
}

Assistant:

Color Scene::shade(Medium& curMed, double weight, Vector p, Vector view, GeometricObject *obj)
{
   SurfaceData txt;
   Ray   ray;
   Color color;
   Vector l;   // light vector
   double sh;  // light shadow coeff.
   Vector h;   // vector between -View and light
   double ln, vn;
   double t;
   bool entering = true; // flag whether we're entering object
   int   i;

   obj->find_texture(p, txt);
   if((vn = view & txt.n) > 0) // force (-View,n) > 0
   {
      txt.n = -txt.n;
      vn = -vn;
      entering = false;
   }

   ray.org = p;
   color = ambient * txt.color * txt.ka; // get ambient light

   for(i = 0; i < light.size(); i++)
   {
      if((sh = light[i]->shadow(this, p,l)) > threshold)
      {
         if((ln = (l & txt.n)) > threshold) //  light is visible
         {
            // Diffuse
            if(txt.kd > threshold)
               color += light[i]->color * txt.color * (txt.kd * sh * ln);

            // Specular & Phong-like
            if(txt.ks > threshold)
            {
               h = normalize(l - view);
               color += light[i]->color * txt.ks * sh * pow(txt.n & h, txt.p);
            }
         }
         else
         if(txt.kt > threshold && ln < -threshold)
         {
            t = -txt.kd * txt.kt * sh * ln;

            if(t > threshold)
               color += light[i]->color * txt.color * t;

            t = txt.ks * txt.kt * sh;

            if(t > threshold)
            {
               if((view - l) > threshold)
               {
                  double eta = (entering ? txt.med.ior : Grayzer::Medium::air.ior) / curMed.ior;
                  h = normalize( -view - l * eta );
                  color += light[i]->color * t * pow(txt.n & h, txt.p);
               }
            }
         }
      }
   }

   double rWeight = weight * txt.kr; // reflected
   double tWeight = weight * txt.kt; // transmitted

   // check for reflected ray
   if(rWeight > threshold && level < maxLevel)
   {
      ray.dir = view - txt.n * (2 * vn); // get reflected ray
      color += txt.kr * trace(curMed, rWeight, ray);
   }

   // check for transmitted ray
   if(tWeight > threshold && level < maxLevel)
   {
      double eta = curMed.ior / (entering ? txt.med.ior : Grayzer::Medium::air.ior);
      double ci = -vn; //  cosine of incident angle
      double ctSq = 1 + eta * eta * (ci *  ci - 1);

      if(ctSq > threshold) // not a Total Internal Reflection
      {
         ray.dir = view * eta + txt.n * (eta * ci - sqrt(ctSq));
         if(entering) // ray enters object
            color += txt.kt * trace(txt.med, tWeight, ray);
         else          // ray leaves object
            color += txt.kt * trace(Grayzer::Medium::air, tWeight, ray);
      }
   }
   return color;
}